

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModuleRoot.cpp
# Opt level: O1

PropertyQueryFlags __thiscall
Js::ModuleRoot::GetPropertyQuery
          (ModuleRoot *this,Var originalInstance,PropertyId propertyId,Var *value,
          PropertyValueInfo *info,ScriptContext *requestContext)

{
  RecyclableObject *instance;
  PropertyIndex PVar1;
  int iVar2;
  BOOL BVar3;
  PropertyQueryFlags PVar4;
  Var pvVar5;
  
  PVar1 = DynamicObject::GetPropertyIndex((DynamicObject *)this,propertyId);
  if (PVar1 != 0xffff) {
    pvVar5 = DynamicObject::GetSlot((DynamicObject *)this,(uint)PVar1);
    *value = pvVar5;
    if (info != (PropertyValueInfo *)0x0) {
      iVar2 = (*(this->super_RootObjectBase).super_DynamicObject.super_RecyclableObject.
                super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                [0x30])(this,(ulong)(uint)propertyId);
      info->m_instance = (RecyclableObject *)this;
      info->m_propertyIndex = PVar1;
      info->m_attributes = (iVar2 != 0) << 2;
      info->flags = InlineCacheNoFlags;
      iVar2 = (*(this->super_RootObjectBase).super_DynamicObject.super_RecyclableObject.
                super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                [0x23])(this,(ulong)(uint)propertyId);
      if (iVar2 != 0) {
        *(undefined1 *)&info->cacheInfoFlag = (char)info->cacheInfoFlag & 0xfb;
      }
    }
    return Property_Found;
  }
  instance = (RecyclableObject *)(this->super_RootObjectBase).hostObject.ptr;
  if ((instance != (RecyclableObject *)0x0) &&
     (BVar3 = JavascriptOperators::GetProperty
                        (instance,propertyId,value,requestContext,(PropertyValueInfo *)0x0),
     BVar3 != 0)) {
    return Property_Found;
  }
  PVar4 = GlobalObject::GetPropertyQuery
                    ((((((this->super_RootObjectBase).super_DynamicObject.super_RecyclableObject.
                         type.ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                     globalObject.ptr,originalInstance,propertyId,value,(PropertyValueInfo *)0x0,
                     requestContext);
  return PVar4;
}

Assistant:

PropertyQueryFlags ModuleRoot::GetPropertyQuery(Var originalInstance, PropertyId propertyId, Var* value, PropertyValueInfo* info, ScriptContext* requestContext)
    {
        PropertyIndex index = GetPropertyIndex(propertyId);
        if (index != Constants::NoSlot)
        {
            *value = this->GetSlot(index);
            if (info) // Avoid testing IsWritable if info not being queried
            {
                PropertyValueInfo::Set(info, this, index, IsWritable(propertyId) ? PropertyWritable : PropertyNone);
#if ENABLE_FIXED_FIELDS
                if (this->IsFixedProperty(propertyId))
                {
                    PropertyValueInfo::DisableStoreFieldCache(info);
                }
#endif
            }
            return PropertyQueryFlags::Property_Found;
        }
        if (this->hostObject && JavascriptOperators::GetProperty(this->hostObject, propertyId, value, requestContext))
        {
            return PropertyQueryFlags::Property_Found;
        }

        //
        // Try checking the global object
        // if the module root doesn't have the property and the host object also doesn't have it
        //

        GlobalObject* globalObj = this->GetLibrary()->GetGlobalObject();
        return globalObj->GlobalObject::GetPropertyQuery(originalInstance, propertyId, value, NULL, requestContext);
    }